

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall ncnn::Net::load_model(Net *this,uchar *_mem)

{
  pointer ppLVar1;
  Layer *pLVar2;
  int iVar3;
  char *__ptr;
  ulong uVar4;
  size_t sStack_80;
  uchar *mem;
  ModelBinFromMemory mb;
  Option local_58;
  
  if ((this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    __ptr = "network graph not ready\n";
LAB_0011d036:
    sStack_80 = 0x18;
LAB_0011d04d:
    fwrite(__ptr,sStack_80,1,_stderr);
  }
  else if (((ulong)_mem & 3) == 0) {
    Option::Option(&local_58);
    local_58.vulkan_compute = this->use_vulkan_compute != 0;
    local_58.use_winograd_convolution = this->use_winograd_convolution;
    local_58.use_sgemm_convolution = this->use_sgemm_convolution;
    local_58.use_int8_inference = this->use_int8_inference;
    mem = _mem;
    ModelBinFromMemory::ModelBinFromMemory(&mb,&mem);
    uVar4 = 0;
    while( true ) {
      ppLVar1 = (this->layers).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->layers).
                        super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3) <= uVar4) {
        return (int)mem - (int)_mem;
      }
      pLVar2 = ppLVar1[uVar4];
      if (pLVar2 == (Layer *)0x0) break;
      iVar3 = (*pLVar2->_vptr_Layer[3])(pLVar2,&mb);
      if (iVar3 != 0) {
        __ptr = "layer load_model failed\n";
        goto LAB_0011d036;
      }
      iVar3 = (*pLVar2->_vptr_Layer[4])(pLVar2,&local_58);
      if (iVar3 != 0) {
        __ptr = "layer create_pipeline failed\n";
        sStack_80 = 0x1d;
        goto LAB_0011d04d;
      }
      uVar4 = uVar4 + 1;
    }
    fprintf(_stderr,"load_model error at layer %d, parameter file has inconsistent content.\n",
            uVar4 & 0xffffffff);
  }
  else {
    fprintf(_stderr,"memory not 32-bit aligned at %p\n",_mem);
  }
  return -1;
}

Assistant:

int Net::upload_model()
{
    ncnn::VkTransfer cmd(vkdev);

    // create gpu device allocator if null
    if (!weight_vkallocator)
    {
        weight_vkallocator = new VkWeightBufferAllocator(vkdev);
    }
    if (!weight_staging_vkallocator)
    {
        weight_staging_vkallocator = new VkWeightStagingBufferAllocator(vkdev);
    }

    cmd.weight_vkallocator = weight_vkallocator;
    cmd.staging_vkallocator = weight_staging_vkallocator;

    for (size_t i=0; i<layers.size(); i++)
    {
        if (layers[i]->support_vulkan)
        {
            int uret = layers[i]->upload_model(cmd);
            if (uret != 0)
            {
                fprintf(stderr, "layer upload_model %d failed\n", (int)i);
                return -1;
            }
        }
    }

    cmd.submit_and_wait();

    return 0;
}